

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcMemberType::IfcMemberType(IfcMemberType *this)

{
  IfcMemberType *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1c0,"IfcMemberType");
  IfcBuildingElementType::IfcBuildingElementType
            ((IfcBuildingElementType *)this,&PTR_construction_vtable_24__010bf010);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcMemberType,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMemberType,_1UL>,
             &PTR_construction_vtable_24__010bf148);
  *(undefined8 *)this = 0x10beee0;
  *(undefined8 *)&this->field_0x1c0 = 0x10beff8;
  *(undefined8 *)&this->field_0x88 = 0x10bef08;
  *(undefined8 *)&this->field_0x98 = 0x10bef30;
  *(undefined8 *)&this->field_0xf0 = 0x10bef58;
  *(undefined8 *)&this->field_0x148 = 0x10bef80;
  *(undefined8 *)&this->field_0x180 = 0x10befa8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMemberType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x10befd0;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMemberType,_1UL>).field_0x10);
  return;
}

Assistant:

IfcMemberType() : Object("IfcMemberType") {}